

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_object_manager.cpp
# Opt level: O3

void __thiscall sc_core::sc_object_manager::remove_object(sc_object_manager *this,string *name)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
          ::find(&(this->m_instance_table)._M_t,name);
  if (((_Rb_tree_header *)iVar1._M_node !=
       &(this->m_instance_table)._M_t._M_impl.super__Rb_tree_header) &&
     (*(int *)&iVar1._M_node[2]._M_parent == 1)) {
    *(undefined8 *)(iVar1._M_node + 2) = 0;
    *(undefined4 *)&iVar1._M_node[2]._M_parent = 0;
  }
  return;
}

Assistant:

void
sc_object_manager::remove_object(const std::string& name)
{
    instance_table_t::iterator it;     // instance table iterator.
    it = m_instance_table.find(name);
    if(it != m_instance_table.end()
       && it->second.m_name_origin == SC_NAME_OBJECT)
    {
        it->second.m_element_p = NULL;
        it->second.m_name_origin = SC_NAME_NONE;
    }
}